

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

ItemBlock * __thiscall
VmaPoolAllocator<VmaAllocation_T>::CreateNewBlock(VmaPoolAllocator<VmaAllocation_T> *this)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  uint32_t uVar4;
  ItemBlock newBlock;
  
  sVar1 = (this->m_ItemBlocks).m_Count;
  if (sVar1 == 0) {
    uVar4 = this->m_FirstBlockCapacity;
  }
  else {
    uVar4 = (this->m_ItemBlocks).m_pArray[sVar1 - 1].Capacity * 3 >> 1;
  }
  newBlock.pItems = (Item *)VmaMalloc(this->m_pAllocationCallbacks,(ulong)uVar4 * 0x58,8);
  newBlock.FirstFreeIndex = 0;
  newBlock.Capacity = uVar4;
  VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
  ::push_back(&this->m_ItemBlocks,&newBlock);
  iVar2 = 1;
  for (lVar3 = 0; (ulong)(uVar4 - 1) * 0x58 - lVar3 != 0; lVar3 = lVar3 + 0x58) {
    *(int *)((long)newBlock.pItems + lVar3) = iVar2;
    iVar2 = iVar2 + 1;
  }
  newBlock.pItems[uVar4 - 1].NextFreeIndex = 0xffffffff;
  return (this->m_ItemBlocks).m_pArray + ((this->m_ItemBlocks).m_Count - 1);
}

Assistant:

typename VmaPoolAllocator<T>::ItemBlock& VmaPoolAllocator<T>::CreateNewBlock()
{
    const uint32_t newBlockCapacity = m_ItemBlocks.empty() ?
        m_FirstBlockCapacity : m_ItemBlocks.back().Capacity * 3 / 2;

    const ItemBlock newBlock =
    {
        vma_new_array(m_pAllocationCallbacks, Item, newBlockCapacity),
        newBlockCapacity,
        0
    };

    m_ItemBlocks.push_back(newBlock);

    // Setup singly-linked list of all free items in this block.
    for (uint32_t i = 0; i < newBlockCapacity - 1; ++i)
        newBlock.pItems[i].NextFreeIndex = i + 1;
    newBlock.pItems[newBlockCapacity - 1].NextFreeIndex = UINT32_MAX;
    return m_ItemBlocks.back();
}